

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_do_readahead
          (filemgr *file,bid_t bid,void *buf,void *buf_aligned,err_log_callback *log_callback)

{
  undefined8 uVar1;
  uint64_t uVar2;
  FdbGcFunc *pFVar3;
  filemgr *file_00;
  uint64_t uVar4;
  void *in_RCX;
  void *in_RDX;
  FdbGcFunc *in_RSI;
  undefined8 *in_RDI;
  err_log_callback *in_R8;
  bid_t writing_bid;
  size_t ii_1;
  uint8_t *ptr;
  char *msg;
  ssize_t r;
  FdbGcFunc auto_unlock;
  plock_entry_t *ee;
  bid_t is_writer;
  bid_t locking_bid;
  size_t ii;
  list<plock_node_*,_std::allocator<plock_node_*>_> plock_entries;
  size_t num_blocks_to_read;
  uint64_t total_blocks;
  Func *in_stack_fffffffffffffe58;
  memory_order order;
  FdbGcFunc *in_stack_fffffffffffffe60;
  anon_class_32_2_2de4cabb *in_stack_fffffffffffffe68;
  function<void_()> *in_stack_fffffffffffffe70;
  uint num_blocks;
  plock *in_stack_fffffffffffffe78;
  filemgr *in_stack_fffffffffffffe80;
  list<plock_node_*,_std::allocator<plock_node_*>_> *in_stack_fffffffffffffe98;
  list<plock_node_*,_std::allocator<plock_node_*>_> *in_stack_fffffffffffffea0;
  char *format;
  ulong local_128;
  ulong local_118;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  bid_t in_stack_ffffffffffffff00;
  ulong local_60;
  ulong local_40;
  fdb_status local_4;
  
  uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe60,
                              (memory_order)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  pFVar3 = (FdbGcFunc *)(uVar2 / *(uint *)(in_RDI + 2));
  local_40 = (ulong)global_config.num_blocks_readahead;
  if (pFVar3 < (FdbGcFunc *)(&in_RSI->done + local_40)) {
    if (pFVar3 < in_RSI) {
      local_128 = 0;
    }
    else {
      local_128 = (long)pFVar3 - (long)in_RSI;
    }
    local_40 = local_128;
  }
  std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::list
            ((list<plock_node_*,_std::allocator<plock_node_*>_> *)0x14811a);
  for (local_60 = 1; local_60 < local_40; local_60 = local_60 + 1) {
    plock_lock(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::push_back
              ((list<plock_node_*,_std::allocator<plock_node_*>_> *)in_stack_fffffffffffffe70,
               (value_type *)in_stack_fffffffffffffe68);
  }
  std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::list
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::function<void()>::
  function<filemgr_do_readahead(filemgr*,unsigned_long,void*,void*,err_log_callback*)::__0,void>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  num_blocks = (uint)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  FdbGcFunc::FdbGcFunc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  order = (memory_order)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  std::function<void_()>::~function((function<void_()> *)0x148248);
  filemgr_do_readahead(filemgr*,unsigned_long,void*,void*,err_log_callback*)::$_0::~__0
            ((anon_class_32_2_2de4cabb *)0x148255);
  file_00 = (filemgr *)
            filemgr_read_blocks(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,num_blocks,
                                (bid_t)in_stack_fffffffffffffe68);
  if (file_00 == (filemgr *)(local_40 * (long)global_config.blocksize)) {
    memcpy(in_RDX,in_RCX,(long)global_config.blocksize);
    for (local_118 = 0; local_118 < local_40; local_118 = local_118 + 1) {
      bcache_write(file_00,in_stack_ffffffffffffff00,
                   (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (bcache_dirty_t)((ulong)in_RCX >> 0x20),SUB81((ulong)in_RCX >> 0x18,0),
                   SUB81((ulong)in_RCX >> 0x10,0));
    }
    local_4 = FDB_RESULT_SUCCESS;
  }
  else {
    format = 
    "Read-ahead error: failed to read BID %lu in a database file \'%s\', num blocks %lu, pos %zu, filesize %zu\n"
    ;
    uVar1 = *in_RDI;
    uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe60,order);
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe60,order);
    fdb_log_impl(in_R8,2,FDB_RESULT_READ_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_do_readahead",0x7da,format,in_RSI,uVar1,local_40,uVar2,uVar4);
    local_4 = FDB_RESULT_READ_FAIL;
    in_stack_fffffffffffffe60 = in_RSI;
  }
  FdbGcFunc::~FdbGcFunc(in_stack_fffffffffffffe60);
  std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::~list
            ((list<plock_node_*,_std::allocator<plock_node_*>_> *)0x148515);
  return local_4;
}

Assistant:

fdb_status filemgr_do_readahead(struct filemgr *file, bid_t bid, void *buf,
                        void* buf_aligned,
                        err_log_callback *log_callback)
{
    uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) / file->blocksize;
    size_t num_blocks_to_read = global_config.num_blocks_readahead;
    if (bid + num_blocks_to_read > total_blocks) {
        num_blocks_to_read = (total_blocks >= bid) ? total_blocks - bid : 0;
    }

    // Should lock all individual blocks except for the first block
    // (the first block is already locked by the caller).
    std::list<plock_entry_t*> plock_entries;
    for (size_t ii = 1; ii < num_blocks_to_read; ++ii) {
        bid_t locking_bid = bid + ii;
        bid_t is_writer = 0; // read operation.
        plock_entry_t* ee = plock_lock(&file->plock, &locking_bid, &is_writer);
        plock_entries.push_back(ee);
    }
    FdbGcFunc auto_unlock{ [file, plock_entries](){
        for (plock_entry_t* ee: plock_entries) {
            plock_unlock(&file->plock, ee);
        }
    } };

    ssize_t r = filemgr_read_blocks(file, buf_aligned, num_blocks_to_read, bid);
    if (r != (ssize_t)num_blocks_to_read * global_config.blocksize) {
        const char *msg = "Read-ahead error: failed to read BID %" _F64 " in a "
            "database file '%s', num blocks %" _F64 ", pos %zu, filesize %zu\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, bid, file->filename, num_blocks_to_read,
                atomic_get_uint64_t(&file->pos),
                atomic_get_uint64_t(&file->latest_filesize));
        return FDB_RESULT_READ_FAIL;
    }

    uint8_t* ptr = (uint8_t*)buf_aligned;

    // Copy the contents of the first block to user's buffer.
    memcpy(buf, ptr, global_config.blocksize);

    for (size_t ii = 0; ii < num_blocks_to_read; ++ii) {
        bid_t writing_bid = bid + ii;
        bcache_write(file, writing_bid, ptr + (ii * global_config.blocksize),
                     BCACHE_REQ_CLEAN, false, true);
    }

    return FDB_RESULT_SUCCESS;
}